

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer_index.h
# Opt level: O0

void __thiscall
BufferIndex<double,_long>::Buffer::range_query
          (Buffer *this,double lower_bound,double upper_bound,
          vector<std::pair<double,_long>,_std::allocator<std::pair<double,_long>_>_> *answers)

{
  bool bVar1;
  vector<std::pair<double,_long>,_std::allocator<std::pair<double,_long>_>_> *in_RSI;
  Buffer *in_RDI;
  double in_XMM0_Qa;
  double in_XMM1_Qa;
  size_t i;
  byte local_31;
  double *__args;
  
  __args = (double *)0x0;
  while( true ) {
    if ((double *)in_RDI->number <= __args) {
      return;
    }
    bVar1 = less_than(in_RDI,in_RDI->keys[(long)__args],in_XMM0_Qa);
    if (!bVar1) break;
    __args = (double *)((long)__args + 1);
  }
  while( true ) {
    local_31 = 0;
    if (__args < (double *)in_RDI->number) {
      bVar1 = greater_than(in_RDI,in_RDI->keys[(long)__args],in_XMM1_Qa);
      local_31 = bVar1 ^ 0xff;
    }
    if ((local_31 & 1) == 0) break;
    std::vector<std::pair<double,long>,std::allocator<std::pair<double,long>>>::
    emplace_back<double_const&,long_const&>(in_RSI,__args,(long *)in_RDI);
    __args = (double *)((long)__args + 1);
  }
  return;
}

Assistant:

void range_query(K lower_bound, K upper_bound, std::vector<std::pair<K, P>>& answers) const {
        for(size_t i = 0; i < number; i++) {
            if (!less_than(keys[i], lower_bound)) {
                while (i < number && !greater_than(keys[i], upper_bound)) {
                    answers.emplace_back(keys[i], payloads[i]);
                    i++;
                }
                return;
            }
        }
    }